

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O3

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,NumericForStatement *num_for,void *data)

{
  size_t *psVar1;
  SyntaxTree *pSVar2;
  GenerateFunction *pGVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  _List_node_base *p_Var8;
  uint uVar9;
  Function *this_00;
  int line;
  ExpVarData_conflict name_exp_data;
  Guard l;
  Guard g;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  ulong local_a8;
  NumericForStatement *local_a0;
  Function *local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  Guard local_50;
  
  local_90._8_8_ = 0;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:869:9)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:869:9)>
             ::_M_manager;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:869:9)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:869:9)>
             ::_M_manager;
  local_e8._M_unused._M_object = this;
  local_90._M_unused._M_object = this;
  Guard::Guard(&local_50,(function<void_()> *)&local_90,(function<void_()> *)&local_e8);
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  uVar4 = GenerateRegisterId(this);
  uVar5 = GenerateRegisterId(this);
  uVar6 = GenerateRegisterId(this);
  local_98 = this->current_function_->function_;
  local_a8 = CONCAT44(local_a8._4_4_,(num_for->name_).line_);
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:879:13)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:879:13)>
             ::_M_manager;
  local_c8._12_4_ = 0;
  local_c8._8_4_ = this->current_function_->register_id_;
  local_b0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:879:13)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:879:13)>
             ::_M_manager;
  local_c8._M_unused._M_object = this;
  Guard::Guard((Guard *)&local_90,(function<void_()> *)&local_e8,(function<void_()> *)&local_c8);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  local_e8._4_4_ = uVar4 + 1;
  local_e8._0_4_ = uVar4;
  pSVar2 = (num_for->exp1_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this);
  Guard::~Guard((Guard *)&local_90);
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:884:13)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:884:13)>
             ::_M_manager;
  local_c8._12_4_ = 0;
  local_c8._8_4_ = this->current_function_->register_id_;
  local_b0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:884:13)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:884:13)>
             ::_M_manager;
  local_c8._M_unused._M_object = this;
  Guard::Guard((Guard *)&local_90,(function<void_()> *)&local_e8,(function<void_()> *)&local_c8);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  local_e8._4_4_ = uVar5 + 1;
  local_e8._0_4_ = uVar5;
  pSVar2 = (num_for->exp2_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this);
  Guard::~Guard((Guard *)&local_90);
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:889:13)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:889:13)>
             ::_M_manager;
  local_c8._12_4_ = 0;
  local_c8._8_4_ = this->current_function_->register_id_;
  local_b0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:889:13)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:889:13)>
             ::_M_manager;
  local_c8._M_unused._M_object = this;
  Guard::Guard((Guard *)&local_90,(function<void_()> *)&local_e8,(function<void_()> *)&local_c8);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  this_00 = local_98;
  pSVar2 = (num_for->exp3_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  local_a0 = num_for;
  if (pSVar2 == (SyntaxTree *)0x0) {
    line = (int)local_a8;
    Function::AddInstruction
              (local_98,(Instruction)((uVar6 & 0xff) << 0x10 | 0x4000000),(int)local_a8);
    Function::AddInstruction(this_00,(Instruction)0x1,line);
  }
  else {
    local_e8._4_4_ = uVar6 + 1;
    local_e8._0_4_ = uVar6;
    (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this);
    this_00 = local_98;
    line = (int)local_a8;
  }
  Guard::~Guard((Guard *)&local_90);
  uVar9 = (uVar4 & 0xff) << 0x10;
  local_a8 = (ulong)(uVar6 & 0xff);
  local_98 = (Function *)CONCAT44(local_98._4_4_,uVar9);
  uVar9 = (uVar5 & 0xff) << 8 | uVar9;
  Function::AddInstruction(this_00,(Instruction)((uVar6 & 0xff) + 0x26000000 + uVar9),line);
  local_e8._8_8_ = local_a0;
  local_d0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:911:9)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:911:9)>
             ::_M_manager;
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:911:9)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:911:9)>
             ::_M_manager;
  local_e8._M_unused._M_object = this;
  local_c8._M_unused._M_object = this;
  Guard::Guard((Guard *)&local_90,(function<void_()> *)&local_e8,(function<void_()> *)&local_c8);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:913:13)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:913:13)>
             ::_M_manager;
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:913:13)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:913:13)>
             ::_M_manager;
  local_c8._M_unused._M_object = this;
  local_70._M_unused._M_object = this;
  Guard::Guard((Guard *)&local_e8,(function<void_()> *)&local_c8,(function<void_()> *)&local_70);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  Function::AddInstruction(this_00,(Instruction)(uVar9 + (int)local_a8 | 0x27000000),line);
  sVar7 = Function::AddInstruction(this_00,(Instruction)0x0,line);
  pGVar3 = this->current_function_;
  p_Var8 = (_List_node_base *)operator_new(0x20);
  p_Var8[1]._M_next = (_List_node_base *)local_a0;
  *(undefined4 *)&p_Var8[1]._M_prev = 1;
  *(int *)((long)&p_Var8[1]._M_prev + 4) = (int)sVar7;
  std::__detail::_List_node_base::_M_hook(p_Var8);
  psVar1 = &(pGVar3->loop_jumps_).
            super__List_base<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  uVar5 = GenerateRegisterId(this);
  InsertName(this,(local_a0->name_).field_0.str_,uVar5);
  uVar4 = (uVar4 & 0xff) * 0x100;
  Function::AddInstruction(this_00,(Instruction)((uVar5 & 0xff) * 0x10000 + uVar4 + 0x6000000),line)
  ;
  pSVar2 = (local_a0->block_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this,0);
  Function::AddInstruction
            (this_00,(Instruction)((int)local_a8 + (uVar4 | (uint)local_98) + 0x16000000),line);
  Guard::~Guard((Guard *)&local_e8);
  sVar7 = Function::AddInstruction(this_00,(Instruction)0x12000000,line);
  pGVar3 = this->current_function_;
  p_Var8 = (_List_node_base *)operator_new(0x20);
  p_Var8[1]._M_next = (_List_node_base *)local_a0;
  *(undefined4 *)&p_Var8[1]._M_prev = 0;
  *(int *)((long)&p_Var8[1]._M_prev + 4) = (int)sVar7;
  std::__detail::_List_node_base::_M_hook(p_Var8);
  psVar1 = &(pGVar3->loop_jumps_).
            super__List_base<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  Guard::~Guard((Guard *)&local_90);
  Guard::~Guard(&local_50);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(NumericForStatement *num_for, void *data)
    {
        CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);

        auto var_register = GenerateRegisterId();
        auto limit_register = GenerateRegisterId();
        auto step_register = GenerateRegisterId();
        auto function = GetCurrentFunction();
        auto line = num_for->name_.line_;

        // Init name, limit, step
        {
            REGISTER_GENERATOR_GUARD();
            ExpVarData name_exp_data{ var_register, var_register + 1 };
            num_for->exp1_->Accept(this, &name_exp_data);
        }
        {
            REGISTER_GENERATOR_GUARD();
            ExpVarData limit_exp_data{ limit_register, limit_register + 1 };
            num_for->exp2_->Accept(this, &limit_exp_data);
        }
        {
            REGISTER_GENERATOR_GUARD();
            if (num_for->exp3_)
            {
                ExpVarData step_exp_data{ step_register, step_register + 1 };
                num_for->exp3_->Accept(this, &step_exp_data);
            }
            else
            {
                // Default step is 1
                auto instruction = Instruction::ACode(OpType_LoadInt, step_register);
                function->AddInstruction(instruction, line);
                // Int value 1
                instruction.opcode_ = 1;
                function->AddInstruction(instruction, line);
            }
        }

        // Init 'for' var, limit, step value
        auto instruction = Instruction::ABCCode(OpType_ForInit, var_register,
                                                limit_register, step_register);
        function->AddInstruction(instruction, line);

        LOOP_GUARD(num_for);
        {
            CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);

            // Check 'for', continue loop or not
            instruction = Instruction::ABCCode(OpType_ForStep, var_register,
                limit_register, step_register);
            function->AddInstruction(instruction, line);

            // Break loop, prepare to jump to the end of the loop
            instruction.opcode_ = 0;
            int index = function->AddInstruction(instruction, line);
            AddLoopJumpInfo(num_for, index, LoopJumpInfo::JumpTail);

            auto name_register = GenerateRegisterId();
            InsertName(num_for->name_.str_, name_register);

            // Prepare name value
            instruction = Instruction::ABCode(OpType_Move, name_register, var_register);
            function->AddInstruction(instruction, line);

            num_for->block_->Accept(this, nullptr);

            // var = var + step
            instruction = Instruction::ABCCode(OpType_Add, var_register,
                var_register, step_register);
            function->AddInstruction(instruction, line);
        }
        // Jump to the begin of the loop
        instruction = Instruction::AsBxCode(OpType_Jmp, 0, 0);
        int index = function->AddInstruction(instruction, line);
        AddLoopJumpInfo(num_for, index, LoopJumpInfo::JumpHead);
    }